

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O2

void verify_horizontal_right(Board *board,int row,int col,Ship *ship)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = (long)ship->length + (long)col;
  if ((int)lVar3 <= board->column) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(board->matrix).
                                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[row].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data + lVar3 * 0x20 + -0x20),"~")
    ;
    if (bVar1) {
      uVar4 = (long)ship->length + (long)col;
      iVar2 = board->column;
      if ((int)uVar4 < iVar2) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(uVar4 * 0x20 +
                                 *(long *)&(board->matrix).
                                           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[row].
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data),"~");
        if (bVar1) {
          ship->sRow = row;
          ship->sCol = col;
          goto LAB_001028b7;
        }
        iVar2 = board->column;
        uVar4 = (ulong)(uint)(ship->length + col);
      }
      ship->sRow = row;
      ship->sCol = col;
      if (iVar2 <= (int)uVar4) {
LAB_001028b7:
        ship->orientation = 'H';
        ship->direction = 1;
        return;
      }
      goto LAB_00102889;
    }
  }
  ship->sRow = row;
  ship->sCol = col;
LAB_00102889:
  ship->orientation = 'N';
  ship->direction = 0;
  return;
}

Assistant:

void verify_horizontal_right( Board *board, int row, int col, Ship *ship )
{
	/*! Checks if the current position plus the rest of the ship exceeds
	 *  the superior border or touches another ship
	 */
    if( ( col + ship->length - 1 <= board->column - 1 ) and ( board->matrix[row][col + ship->length - 1] == "~" ) )
	{
        if( ( col + ship->length <= board->column - 1 ) and ( board->matrix[row][col + ship->length] == "~" ) ) 
        {
            ship->set_values( row, col, 'H', 1 );
        }
        else if( col + ship->length > board->column - 1 )
        {
            ship->set_values( row, col, 'H', 1 );
        }
        else
        {
            ship->set_values( row, col, 'N' , 0 );
        }
    }
    else
    {
        ship->set_values( row, col, 'N' , 0 );
    }
}